

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkClpOneGia_rec(Gia_Man_t *pNew,Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int in_EDX;
  int Fill;
  
  pAVar2 = pNode->pNtk;
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((((pAVar2->vTravIds).pArray[iVar6] != iVar1) && ((pNode->vFanins).nSize != 0)) &&
     (uVar4 = *(uint *)&pNode->field_0x14 & 0xf, uVar4 != 2)) {
    if (uVar4 == 7) {
      iVar6 = pNode->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
      if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar6] = iVar1;
      uVar4 = Abc_NtkClpOneGia_rec
                        (pNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
      uVar5 = Abc_NtkClpOneGia_rec
                        (pNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
      if ((-1 < (int)uVar4) && (-1 < (int)uVar5)) {
        iVar6 = Gia_ManHashAnd(pNew,*(uint *)&pNode->field_0x14 >> 10 & 1 ^ uVar4,
                               *(uint *)&pNode->field_0x14 >> 0xb & 1 ^ uVar5);
        (pNode->field_6).iTemp = iVar6;
        return iVar6;
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    if (uVar4 != 5) {
      __assert_fail("Abc_ObjIsNode( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                    ,0xc80,"int Abc_NtkClpOneGia_rec(Gia_Man_t *, Abc_Obj_t *)");
    }
  }
  return (pNode->field_6).iTemp;
}

Assistant:

int Abc_NtkClpOneGia_rec( Gia_Man_t * pNew, Abc_Obj_t * pNode )
{
    int iLit0, iLit1;
    if ( Abc_NodeIsTravIdCurrent(pNode) || Abc_ObjFaninNum(pNode) == 0 || Abc_ObjIsCi(pNode) )
        return pNode->iTemp;
    assert( Abc_ObjIsNode( pNode ) );
    Abc_NodeSetTravIdCurrent( pNode );
    iLit0 = Abc_NtkClpOneGia_rec( pNew, Abc_ObjFanin0(pNode) );
    iLit1 = Abc_NtkClpOneGia_rec( pNew, Abc_ObjFanin1(pNode) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_ObjFaninC0(pNode) );
    iLit1 = Abc_LitNotCond( iLit1, Abc_ObjFaninC1(pNode) );
    return (pNode->iTemp = Gia_ManHashAnd(pNew, iLit0, iLit1));
}